

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

void __thiscall
wallet::LegacyDataSPKM::LoadKeyPool(LegacyDataSPKM *this,int64_t nIndex,CKeyPool *keypool)

{
  int64_t iVar1;
  mapped_type *pmVar2;
  size_type sVar3;
  mapped_type *this_00;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock37;
  CKeyID keyid;
  int64_t local_c8;
  unique_lock<std::recursive_mutex> local_c0;
  CKeyMetadata local_b0;
  CKeyID local_3c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = nIndex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_c0,
             &(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x4a0,false);
  lVar4 = 0x290;
  if ((keypool->fInternal & 1U) != 0) {
    lVar4 = 0x260;
  }
  lVar5 = 0x2c0;
  if (keypool->m_pre_split == false) {
    lVar5 = lVar4;
  }
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>
            ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
             ((long)&(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan + lVar5),&local_c8);
  iVar1 = local_c8;
  lVar4 = this->m_max_keypool_index;
  if (this->m_max_keypool_index <= local_c8) {
    lVar4 = local_c8;
  }
  this->m_max_keypool_index = lVar4;
  CPubKey::GetID((CKeyID *)&local_b0,&keypool->vchPubKey);
  pmVar2 = std::
           map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
           operator[](&this->m_pool_key_to_index,(key_type *)&local_b0);
  *pmVar2 = iVar1;
  CPubKey::GetID(&local_3c,&keypool->vchPubKey);
  sVar3 = std::
          map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
          ::count(&this->mapKeyMetadata,&local_3c);
  if (sVar3 == 0) {
    CKeyMetadata::CKeyMetadata(&local_b0,keypool->nTime);
    this_00 = std::
              map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
              ::operator[](&this->mapKeyMetadata,&local_3c);
    CKeyMetadata::operator=(this_00,&local_b0);
    CKeyMetadata::~CKeyMetadata(&local_b0);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyDataSPKM::LoadKeyPool(int64_t nIndex, const CKeyPool &keypool)
{
    LOCK(cs_KeyStore);
    if (keypool.m_pre_split) {
        set_pre_split_keypool.insert(nIndex);
    } else if (keypool.fInternal) {
        setInternalKeyPool.insert(nIndex);
    } else {
        setExternalKeyPool.insert(nIndex);
    }
    m_max_keypool_index = std::max(m_max_keypool_index, nIndex);
    m_pool_key_to_index[keypool.vchPubKey.GetID()] = nIndex;

    // If no metadata exists yet, create a default with the pool key's
    // creation time. Note that this may be overwritten by actually
    // stored metadata for that key later, which is fine.
    CKeyID keyid = keypool.vchPubKey.GetID();
    if (mapKeyMetadata.count(keyid) == 0)
        mapKeyMetadata[keyid] = CKeyMetadata(keypool.nTime);
}